

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O0

void free_config_fields(Configurable *config)

{
  getout *pgVar1;
  getout *next;
  getout *urlnode;
  Configurable *config_local;
  
  if (config->easy != (CURL *)0x0) {
    curl_easy_cleanup(config->easy);
    config->easy = (CURL *)0x0;
  }
  if (config->random_file != (char *)0x0) {
    free(config->random_file);
    config->random_file = (char *)0x0;
  }
  if (config->egd_file != (char *)0x0) {
    free(config->egd_file);
    config->egd_file = (char *)0x0;
  }
  if (config->useragent != (char *)0x0) {
    free(config->useragent);
    config->useragent = (char *)0x0;
  }
  if (config->cookie != (char *)0x0) {
    free(config->cookie);
    config->cookie = (char *)0x0;
  }
  if (config->cookiejar != (char *)0x0) {
    free(config->cookiejar);
    config->cookiejar = (char *)0x0;
  }
  if (config->cookiefile != (char *)0x0) {
    free(config->cookiefile);
    config->cookiefile = (char *)0x0;
  }
  if (config->postfields != (char *)0x0) {
    free(config->postfields);
    config->postfields = (char *)0x0;
  }
  if (config->referer != (char *)0x0) {
    free(config->referer);
    config->referer = (char *)0x0;
  }
  if (config->headerfile != (char *)0x0) {
    free(config->headerfile);
    config->headerfile = (char *)0x0;
  }
  if (config->ftpport != (char *)0x0) {
    free(config->ftpport);
    config->ftpport = (char *)0x0;
  }
  if (config->iface != (char *)0x0) {
    free(config->iface);
    config->iface = (char *)0x0;
  }
  if (config->range != (char *)0x0) {
    free(config->range);
    config->range = (char *)0x0;
  }
  if (config->userpwd != (char *)0x0) {
    free(config->userpwd);
    config->userpwd = (char *)0x0;
  }
  if (config->tls_username != (char *)0x0) {
    free(config->tls_username);
    config->tls_username = (char *)0x0;
  }
  if (config->tls_password != (char *)0x0) {
    free(config->tls_password);
    config->tls_password = (char *)0x0;
  }
  if (config->tls_authtype != (char *)0x0) {
    free(config->tls_authtype);
    config->tls_authtype = (char *)0x0;
  }
  if (config->proxyuserpwd != (char *)0x0) {
    free(config->proxyuserpwd);
    config->proxyuserpwd = (char *)0x0;
  }
  if (config->proxy != (char *)0x0) {
    free(config->proxy);
    config->proxy = (char *)0x0;
  }
  if (config->noproxy != (char *)0x0) {
    free(config->noproxy);
    config->noproxy = (char *)0x0;
  }
  if (config->mail_from != (char *)0x0) {
    free(config->mail_from);
    config->mail_from = (char *)0x0;
  }
  curl_slist_free_all(config->mail_rcpt);
  if (config->mail_auth != (char *)0x0) {
    free(config->mail_auth);
    config->mail_auth = (char *)0x0;
  }
  if (config->netrc_file != (char *)0x0) {
    free(config->netrc_file);
    config->netrc_file = (char *)0x0;
  }
  pgVar1 = config->url_list;
  while (next = pgVar1, next != (getout *)0x0) {
    pgVar1 = next->next;
    if (next->url != (char *)0x0) {
      free(next->url);
      next->url = (char *)0x0;
    }
    if (next->outfile != (char *)0x0) {
      free(next->outfile);
      next->outfile = (char *)0x0;
    }
    if (next->infile != (char *)0x0) {
      free(next->infile);
      next->infile = (char *)0x0;
    }
    if (next != (getout *)0x0) {
      free(next);
    }
  }
  config->url_list = (getout *)0x0;
  config->url_last = (getout *)0x0;
  config->url_get = (getout *)0x0;
  config->url_out = (getout *)0x0;
  if (config->cipher_list != (char *)0x0) {
    free(config->cipher_list);
    config->cipher_list = (char *)0x0;
  }
  if (config->cert != (char *)0x0) {
    free(config->cert);
    config->cert = (char *)0x0;
  }
  if (config->cert_type != (char *)0x0) {
    free(config->cert_type);
    config->cert_type = (char *)0x0;
  }
  if (config->cacert != (char *)0x0) {
    free(config->cacert);
    config->cacert = (char *)0x0;
  }
  if (config->capath != (char *)0x0) {
    free(config->capath);
    config->capath = (char *)0x0;
  }
  if (config->crlfile != (char *)0x0) {
    free(config->crlfile);
    config->crlfile = (char *)0x0;
  }
  if (config->key != (char *)0x0) {
    free(config->key);
    config->key = (char *)0x0;
  }
  if (config->key_type != (char *)0x0) {
    free(config->key_type);
    config->key_type = (char *)0x0;
  }
  if (config->key_passwd != (char *)0x0) {
    free(config->key_passwd);
    config->key_passwd = (char *)0x0;
  }
  if (config->pubkey != (char *)0x0) {
    free(config->pubkey);
    config->pubkey = (char *)0x0;
  }
  if (config->hostpubmd5 != (char *)0x0) {
    free(config->hostpubmd5);
    config->hostpubmd5 = (char *)0x0;
  }
  if (config->engine != (char *)0x0) {
    free(config->engine);
    config->engine = (char *)0x0;
  }
  if (config->customrequest != (char *)0x0) {
    free(config->customrequest);
    config->customrequest = (char *)0x0;
  }
  if (config->krblevel != (char *)0x0) {
    free(config->krblevel);
    config->krblevel = (char *)0x0;
  }
  if (config->trace_dump != (char *)0x0) {
    free(config->trace_dump);
    config->trace_dump = (char *)0x0;
  }
  config->trace_stream = (FILE *)0x0;
  if (config->writeout != (char *)0x0) {
    free(config->writeout);
    config->writeout = (char *)0x0;
  }
  config->errors = (FILE *)0x0;
  curl_slist_free_all(config->quote);
  curl_slist_free_all(config->postquote);
  curl_slist_free_all(config->prequote);
  curl_slist_free_all(config->headers);
  if (config->httppost != (curl_httppost *)0x0) {
    curl_formfree(config->httppost);
    config->httppost = (curl_httppost *)0x0;
  }
  config->last_post = (curl_httppost *)0x0;
  curl_slist_free_all(config->telnet_options);
  curl_slist_free_all(config->resolve);
  if (config->socksproxy != (char *)0x0) {
    free(config->socksproxy);
    config->socksproxy = (char *)0x0;
  }
  if (config->socks5_gssapi_service != (char *)0x0) {
    free(config->socks5_gssapi_service);
    config->socks5_gssapi_service = (char *)0x0;
  }
  if (config->ftp_account != (char *)0x0) {
    free(config->ftp_account);
    config->ftp_account = (char *)0x0;
  }
  if (config->ftp_alternative_to_user != (char *)0x0) {
    free(config->ftp_alternative_to_user);
    config->ftp_alternative_to_user = (char *)0x0;
  }
  if (config->libcurl != (char *)0x0) {
    free(config->libcurl);
    config->libcurl = (char *)0x0;
  }
  return;
}

Assistant:

void free_config_fields(struct Configurable *config)
{
  struct getout *urlnode;

  if(config->easy) {
    curl_easy_cleanup(config->easy);
    config->easy = NULL;
  }

  Curl_safefree(config->random_file);
  Curl_safefree(config->egd_file);
  Curl_safefree(config->useragent);
  Curl_safefree(config->cookie);
  Curl_safefree(config->cookiejar);
  Curl_safefree(config->cookiefile);

  Curl_safefree(config->postfields);
  Curl_safefree(config->referer);

  Curl_safefree(config->headerfile);
  Curl_safefree(config->ftpport);
  Curl_safefree(config->iface);

  Curl_safefree(config->range);

  Curl_safefree(config->userpwd);
  Curl_safefree(config->tls_username);
  Curl_safefree(config->tls_password);
  Curl_safefree(config->tls_authtype);
  Curl_safefree(config->proxyuserpwd);
  Curl_safefree(config->proxy);

  Curl_safefree(config->noproxy);

  Curl_safefree(config->mail_from);
  curl_slist_free_all(config->mail_rcpt);
  Curl_safefree(config->mail_auth);

  Curl_safefree(config->netrc_file);

  urlnode = config->url_list;
  while(urlnode) {
    struct getout *next = urlnode->next;
    Curl_safefree(urlnode->url);
    Curl_safefree(urlnode->outfile);
    Curl_safefree(urlnode->infile);
    Curl_safefree(urlnode);
    urlnode = next;
  }
  config->url_list = NULL;
  config->url_last = NULL;
  config->url_get = NULL;
  config->url_out = NULL;

  Curl_safefree(config->cipher_list);
  Curl_safefree(config->cert);
  Curl_safefree(config->cert_type);
  Curl_safefree(config->cacert);
  Curl_safefree(config->capath);
  Curl_safefree(config->crlfile);
  Curl_safefree(config->key);
  Curl_safefree(config->key_type);
  Curl_safefree(config->key_passwd);
  Curl_safefree(config->pubkey);
  Curl_safefree(config->hostpubmd5);
  Curl_safefree(config->engine);

  Curl_safefree(config->customrequest);
  Curl_safefree(config->krblevel);
  Curl_safefree(config->trace_dump);

  config->trace_stream = NULL; /* closed elsewhere when appropriate */

  Curl_safefree(config->writeout);

  config->errors = NULL; /* closed elsewhere when appropriate */

  curl_slist_free_all(config->quote);
  curl_slist_free_all(config->postquote);
  curl_slist_free_all(config->prequote);

  curl_slist_free_all(config->headers);

  if(config->httppost) {
    curl_formfree(config->httppost);
    config->httppost = NULL;
  }
  config->last_post = NULL;

  curl_slist_free_all(config->telnet_options);
  curl_slist_free_all(config->resolve);

  Curl_safefree(config->socksproxy);
  Curl_safefree(config->socks5_gssapi_service);

  Curl_safefree(config->ftp_account);
  Curl_safefree(config->ftp_alternative_to_user);

  Curl_safefree(config->libcurl);
}